

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<17>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  RepeatedField<int> *array;
  long lVar7;
  long lVar8;
  
  if (*field != 0) {
    uVar5 = md->tag;
    pbVar2 = output->ptr;
    if (uVar5 < 0x80) {
      *pbVar2 = (byte)uVar5;
      pbVar2 = pbVar2 + 1;
    }
    else {
      *pbVar2 = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        pbVar2[1] = (byte)(uVar5 >> 7);
        pbVar2 = pbVar2 + 2;
      }
      else {
        pbVar2 = pbVar2 + 2;
        uVar5 = uVar5 >> 7;
        do {
          pbVar3 = pbVar2;
          pbVar3[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          pbVar2 = pbVar3 + 1;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar1);
        *pbVar3 = (byte)uVar6;
      }
    }
    output->ptr = pbVar2;
    uVar5 = *(uint *)((long)field + 0x10);
    if (uVar5 < 0x80) {
      *pbVar2 = (byte)uVar5;
      pbVar2 = pbVar2 + 1;
    }
    else {
      *pbVar2 = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        pbVar2[1] = (byte)(uVar5 >> 7);
        pbVar2 = pbVar2 + 2;
      }
      else {
        pbVar2 = pbVar2 + 2;
        uVar5 = uVar5 >> 7;
        do {
          pbVar3 = pbVar2;
          pbVar3[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          pbVar2 = pbVar3 + 1;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar1);
        *pbVar3 = (byte)uVar6;
      }
    }
    output->ptr = pbVar2;
    if (0 < *field) {
      lVar8 = 0;
      lVar7 = 0;
      do {
        puVar4 = PrimitiveTypeHelper<17>::SerializeToArray
                           ((void *)(*(long *)((long)field + 8) + lVar8),output->ptr);
        output->ptr = puVar4;
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 4;
      } while (lVar7 < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}